

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.h
# Opt level: O2

void __thiscall tvm::runtime::NDArray::CopyTo(NDArray *this,DLTensor *other)

{
  ostream *poVar1;
  Container *from;
  LogMessageFatal local_1a0;
  
  from = this->data_;
  if (from == (Container *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/ndarray.h"
               ,0x16d);
    poVar1 = std::operator<<((ostream *)&local_1a0,"Check failed: data_ != nullptr");
    std::operator<<(poVar1,": ");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
    from = this->data_;
  }
  CopyFromTo(&from->dl_tensor,other,(TVMStreamHandle)0x0);
  return;
}

Assistant:

inline void NDArray::CopyTo(DLTensor *other) const {
  CHECK(data_ != nullptr);
  CopyFromTo(&(data_->dl_tensor), other);
}